

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImRect ImGui::TableGetCellBgRect(ImGuiTable *table,int column_n)

{
  float fVar1;
  float fVar2;
  ImGuiTableColumn *pIVar3;
  uint uVar4;
  float fVar5;
  ImRect IVar6;
  
  if ((-1 < column_n) &&
     (pIVar3 = (table->Columns).Data + column_n, pIVar3 < (table->Columns).DataEnd)) {
    fVar1 = (table->WorkRect).Min.x;
    uVar4 = -(uint)(fVar1 <= pIVar3->MinX);
    fVar2 = (table->WorkRect).Max.x;
    fVar5 = pIVar3->MaxX;
    if (fVar2 <= pIVar3->MaxX) {
      fVar5 = fVar2;
    }
    IVar6.Max.y = table->RowPosY2;
    IVar6.Max.x = fVar5;
    IVar6.Min.y = table->RowPosY1;
    IVar6.Min.x = (float)(~uVar4 & (uint)fVar1 | (uint)pIVar3->MinX & uVar4);
    return IVar6;
  }
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_internal.h"
                ,600,
                "const T &ImSpan<ImGuiTableColumn>::operator[](int) const [T = ImGuiTableColumn]");
}

Assistant:

inline const T&     operator[](int i) const     { const T* p = Data + i; IM_ASSERT(p >= Data && p < DataEnd); return *p; }